

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerGLSL::to_array_size_literal(CompilerGLSL *this,SPIRType *type,uint32_t index)

{
  size_t sVar1;
  size_t sVar2;
  bool *pbVar3;
  uint *puVar4;
  uint32_t index_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  sVar1 = VectorView<unsigned_int>::size(&(type->array).super_VectorView<unsigned_int>);
  sVar2 = VectorView<bool>::size(&(type->array_size_literal).super_VectorView<bool>);
  if (sVar1 == sVar2) {
    pbVar3 = VectorView<bool>::operator[]
                       (&(type->array_size_literal).super_VectorView<bool>,(ulong)index);
    if ((*pbVar3 & 1U) == 0) {
      puVar4 = VectorView<unsigned_int>::operator[]
                         (&(type->array).super_VectorView<unsigned_int>,(ulong)index);
      this_local._4_4_ = Compiler::evaluate_constant_u32(&this->super_Compiler,*puVar4);
    }
    else {
      puVar4 = VectorView<unsigned_int>::operator[]
                         (&(type->array).super_VectorView<unsigned_int>,(ulong)index);
      this_local._4_4_ = *puVar4;
    }
    return this_local._4_4_;
  }
  __assert_fail("type.array.size() == type.array_size_literal.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_glsl.cpp"
                ,0x3d77,
                "uint32_t spirv_cross::CompilerGLSL::to_array_size_literal(const SPIRType &, uint32_t) const"
               );
}

Assistant:

uint32_t CompilerGLSL::to_array_size_literal(const SPIRType &type, uint32_t index) const
{
	assert(type.array.size() == type.array_size_literal.size());

	if (type.array_size_literal[index])
	{
		return type.array[index];
	}
	else
	{
		// Use the default spec constant value.
		// This is the best we can do.
		return evaluate_constant_u32(type.array[index]);
	}
}